

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O1

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  size_t sVar1;
  ulong uVar2;
  stream_core *psVar3;
  error_category *peVar4;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *pbVar5;
  service_type *psVar6;
  steady_timer *psVar7;
  want wVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  non_const_lvalue<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>
  handler2;
  code *pcVar12;
  implementation_type *impl;
  long *plVar13;
  service_type *this_00;
  stream_core *psVar14;
  transfer_all_t local_59;
  undefined8 local_58;
  error_category *peStack_50;
  int local_44;
  error_category *local_40;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *local_38;
  
  local_40 = ec._M_cat;
  local_44 = ec._M_value;
  this->start_ = start;
  if (start != 1) goto LAB_001ceab6;
  do {
    this->bytes_transferred_ = 0;
    pcVar12 = engine::do_accept;
    if ((this->op_).type_ == client) {
      pcVar12 = engine::do_connect;
    }
    wVar8 = engine::perform(&this->core_->engine_,(offset_in_engine_to_subr)pcVar12,(void *)0x0,0,
                            (error_code *)0x0,(size_t *)&this->ec_);
    this->want_ = wVar8;
    if (wVar8 == want_input_and_retry) {
      psVar14 = this->core_;
      sVar1 = (psVar14->input_).size_;
      if (sVar1 == 0) {
        impl = &(psVar14->pending_read_).impl_.implementation_;
        if ((psVar14->pending_read_).impl_.implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
          peStack_50 = (error_category *)std::_V2::system_category();
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((psVar14->pending_read_).impl_.service_,impl,(error_code *)&local_58);
          (psVar14->pending_read_).impl_.implementation_.expiry.__d.__r = 0x7fffffffffffffff;
          pbVar5 = this->next_layer_;
          local_58 = (this->core_->input_buffer_).data_;
          peStack_50 = (error_category *)(this->core_->input_buffer_).size_;
          psVar6 = (pbVar5->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_
          ;
          goto LAB_001cee66;
        }
        this_00 = (psVar14->pending_read_).impl_.service_;
        psVar7 = &psVar14->pending_read_;
        goto LAB_001cee83;
      }
      uVar9 = BIO_write((BIO *)(psVar14->engine_).ext_bio_,(psVar14->input_).data_,(int)sVar1);
      uVar11 = 0;
      if (0 < (int)uVar9) {
        uVar11 = (ulong)uVar9;
      }
      uVar2 = (psVar14->input_).size_;
      if (uVar2 < uVar11) {
        uVar11 = uVar2;
      }
      psVar3 = this->core_;
      (psVar3->input_).data_ = (void *)(uVar11 + (long)(psVar14->input_).data_);
      (psVar3->input_).size_ = uVar2 - uVar11;
    }
    else {
      if ((wVar8 == want_output_and_retry) || (wVar8 == want_output)) {
        psVar14 = this->core_;
        impl = &(psVar14->pending_write_).impl_.implementation_;
        if ((psVar14->pending_write_).impl_.implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
          peStack_50 = (error_category *)std::_V2::system_category();
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((psVar14->pending_write_).impl_.service_,impl,(error_code *)&local_58);
          (psVar14->pending_write_).impl_.implementation_.expiry.__d.__r = 0x7fffffffffffffff;
          pbVar5 = this->next_layer_;
          psVar14 = this->core_;
          uVar9 = BIO_read((BIO *)(psVar14->engine_).ext_bio_,(psVar14->output_buffer_).data_,
                           (int)(psVar14->output_buffer_).size_);
          peStack_50 = (error_category *)0x0;
          if (0 < (int)uVar9) {
            peStack_50 = (error_category *)(ulong)uVar9;
          }
          local_58 = (psVar14->output_buffer_).data_;
          peVar4 = (error_category *)(psVar14->output_buffer_).size_;
          if (peVar4 < peStack_50) {
            peStack_50 = peVar4;
          }
          local_38 = pbVar5;
          asio::detail::
          initiate_async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
          operator()((initiate_async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
                      *)&local_38,this,(mutable_buffer *)&local_58,&local_59);
          return;
        }
        this_00 = (psVar14->pending_write_).impl_.service_;
        psVar7 = &psVar14->pending_write_;
LAB_001cee83:
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
        ::
        async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>,asio::any_io_executor>
                  ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                    *)this_00,impl,this,&(psVar7->impl_).executor_);
        return;
      }
      if (start != 0) {
        pbVar5 = this->next_layer_;
        local_58 = (this->core_->input_buffer_).data_;
        peStack_50 = (error_category *)0x0;
        psVar6 = (pbVar5->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_;
LAB_001cee66:
        asio::detail::reactive_socket_service_base::
        async_receive<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>,asio::any_io_executor>
                  (&psVar6->super_reactive_socket_service_base,
                   &(pbVar5->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                    implementation_.super_base_implementation_type,(mutable_buffers_1 *)&local_58,0,
                   this,&(pbVar5->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                         executor_);
        return;
      }
LAB_001ceab6:
      uVar11 = 0;
      if ((bytes_transferred != 0xffffffffffffffff) &&
         (uVar11 = bytes_transferred, (this->ec_)._M_value == 0)) {
        (this->ec_)._M_value = local_44;
        (this->ec_)._M_cat = local_40;
      }
      bytes_transferred = uVar11;
      wVar8 = this->want_;
      if (wVar8 == want_input_and_retry) {
        psVar14 = this->core_;
        uVar11 = (psVar14->input_buffer_).size_;
        if (bytes_transferred <= uVar11) {
          uVar11 = bytes_transferred;
        }
        (psVar14->input_).data_ = (psVar14->input_buffer_).data_;
        (psVar14->input_).size_ = uVar11;
        psVar14 = this->core_;
        uVar9 = BIO_write((BIO *)(psVar14->engine_).ext_bio_,(psVar14->input_).data_,
                          (int)(psVar14->input_).size_);
        uVar11 = 0;
        if (0 < (int)uVar9) {
          uVar11 = (ulong)uVar9;
        }
        uVar2 = (psVar14->input_).size_;
        if (uVar2 < uVar11) {
          uVar11 = uVar2;
        }
        psVar3 = this->core_;
        (psVar3->input_).data_ = (void *)(uVar11 + (long)(psVar14->input_).data_);
        (psVar3->input_).size_ = uVar2 - uVar11;
        psVar14 = this->core_;
        local_58 = (void *)((ulong)local_58 & 0xffffffff00000000);
        peStack_50 = (error_category *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar14->pending_read_).impl_.service_,
                 &(psVar14->pending_read_).impl_.implementation_,(error_code *)&local_58);
        (psVar14->pending_read_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
      }
      else {
        if (wVar8 != want_output_and_retry) {
          if (wVar8 == want_output) {
            psVar14 = this->core_;
            local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
            peStack_50 = (error_category *)std::_V2::system_category();
            asio::detail::
            deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::cancel((psVar14->pending_write_).impl_.service_,
                     &(psVar14->pending_write_).impl_.implementation_,(error_code *)&local_58);
            (psVar14->pending_write_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
          }
          psVar14 = this->core_;
          goto LAB_001ced32;
        }
        psVar14 = this->core_;
        local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
        peStack_50 = (error_category *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar14->pending_write_).impl_.service_,
                 &(psVar14->pending_write_).impl_.implementation_,(error_code *)&local_58);
        (psVar14->pending_write_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
      }
    }
  } while ((this->ec_)._M_value == 0);
  psVar14 = this->core_;
LAB_001ced32:
  std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_58,eof);
  if ((((this->ec_)._M_cat == peStack_50) && ((this->ec_)._M_value == (int)local_58)) &&
     ((lVar10 = BIO_ctrl((BIO *)(psVar14->engine_).ext_bio_,0xd,0,(void *)0x0), (int)lVar10 != 0 ||
      (uVar9 = SSL_get_shutdown((SSL *)(psVar14->engine_).ssl_), (uVar9 & 2) == 0)))) {
    std::error_code::operator=(&this->ec_,stream_truncated);
  }
  pcVar12 = (code *)(this->handler_)._M_f;
  plVar13 = (long *)((long)(&(((this->handler_)._M_bound_args.
                               super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
                               .super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl
                              )->resolver_).impl_.executor_ + -1) +
                    *(long *)&(this->handler_).field_0x8);
  if (((ulong)pcVar12 & 1) != 0) {
    pcVar12 = *(code **)(pcVar12 + *plVar13 + -1);
  }
  (*pcVar12)(plVar13,&(this->handler_)._M_bound_args.
                      super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
                      .
                      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
                      .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>,
             &(this->handler_)._M_bound_args.
              super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .
              super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .
              super__Tuple_impl<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .
              super__Head_base<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
             ,(this->handler_)._M_bound_args.
              super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .
              super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .
              super__Tuple_impl<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
              .super__Tuple_impl<3UL,_unsigned_long,_std::_Placeholder<1>_>.
              super__Head_base<3UL,_unsigned_long,_false>._M_head_impl,&this->ec_);
  return;
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }